

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

unsigned_long QUtil::get_next_utf8_codepoint(string *utf8_val,size_t *pos,bool *error)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong local_60;
  unsigned_long lower_bound;
  unsigned_long codepoint;
  uchar to_clear;
  ulong uStack_48;
  uint bit_check;
  size_t bytes_needed;
  uchar ch;
  size_t len;
  size_t o_pos;
  bool *error_local;
  size_t *pos_local;
  string *utf8_val_local;
  
  sVar2 = *pos;
  uVar3 = std::__cxx11::string::length();
  *pos = *pos + 1;
  pbVar4 = (byte *)std::__cxx11::string::at((ulong)utf8_val);
  bVar1 = *pbVar4;
  *error = false;
  if (bVar1 < 0x80) {
    utf8_val_local = (string *)(ulong)bVar1;
  }
  else {
    uStack_48 = 0;
    codepoint._3_1_ = 0x80;
    for (codepoint._4_4_ = 0x40; (bVar1 & codepoint._4_4_) != 0;
        codepoint._4_4_ = codepoint._4_4_ >> 1) {
      uStack_48 = uStack_48 + 1;
      codepoint._3_1_ = codepoint._3_1_ | (byte)codepoint._4_4_;
    }
    if (((uStack_48 < 6) && (uStack_48 != 0)) && (*pos + uStack_48 <= uVar3)) {
      lower_bound = (unsigned_long)(int)((uint)bVar1 & (codepoint._3_1_ ^ 0xffffffff));
      while (uStack_48 != 0) {
        uStack_48 = uStack_48 - 1;
        *pos = *pos + 1;
        pbVar4 = (byte *)std::__cxx11::string::at((ulong)utf8_val);
        if ((*pbVar4 & 0xc0) != 0x80) {
          *pos = *pos - 1;
          *error = true;
          return 0xfffd;
        }
        lower_bound = (long)(int)(*pbVar4 & 0x3f) + lower_bound * 0x40;
      }
      switch(*pos - sVar2) {
      case 2:
        local_60 = 0x80;
        break;
      case 3:
        local_60 = 0x800;
        break;
      case 4:
        local_60 = 0x10000;
        break;
      case 5:
        local_60 = 0x1000;
        break;
      case 6:
        local_60 = 0x4000000;
        break;
      default:
        local_60 = 0;
      }
      if ((local_60 != 0) && (lower_bound < local_60)) {
        *error = true;
      }
      utf8_val_local = (string *)lower_bound;
    }
    else {
      *error = true;
      utf8_val_local = (string *)0xfffd;
    }
  }
  return (unsigned_long)utf8_val_local;
}

Assistant:

unsigned long
QUtil::get_next_utf8_codepoint(std::string const& utf8_val, size_t& pos, bool& error)
{
    auto o_pos = pos;
    size_t len = utf8_val.length();
    unsigned char ch = static_cast<unsigned char>(utf8_val.at(pos++));
    error = false;
    if (ch < 128) {
        return static_cast<unsigned long>(ch);
    }

    size_t bytes_needed = 0;
    unsigned bit_check = 0x40;
    unsigned char to_clear = 0x80;
    while (ch & bit_check) {
        ++bytes_needed;
        to_clear = static_cast<unsigned char>(to_clear | bit_check);
        bit_check >>= 1;
    }
    if (((bytes_needed > 5) || (bytes_needed < 1)) || ((pos + bytes_needed) > len)) {
        error = true;
        return 0xfffd;
    }

    auto codepoint = static_cast<unsigned long>(ch & ~to_clear);
    while (bytes_needed > 0) {
        --bytes_needed;
        ch = static_cast<unsigned char>(utf8_val.at(pos++));
        if ((ch & 0xc0) != 0x80) {
            --pos;
            error = true;
            return 0xfffd;
        }
        codepoint <<= 6;
        codepoint += (ch & 0x3f);
    }
    unsigned long lower_bound = 0;
    switch (pos - o_pos) {
    case 2:
        lower_bound = 1 << 7;
        break;
    case 3:
        lower_bound = 1 << 11;
        break;
    case 4:
        lower_bound = 1 << 16;
        break;
    case 5:
        lower_bound = 1 << 12;
        break;
    case 6:
        lower_bound = 1 << 26;
        break;
    default:
        lower_bound = 0;
    }

    if (lower_bound > 0 && codepoint < lower_bound) {
        // Too many bytes were used, but return whatever character was encoded.
        error = true;
    }
    return codepoint;
}